

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChSystem.cpp
# Opt level: O2

void __thiscall chrono::ChSystem::SetCollisionSystemType(ChSystem *this,ChCollisionSystemType type)

{
  element_type *peVar1;
  ChLog *pCVar2;
  __shared_ptr<chrono::collision::ChCollisionSystemBullet,_(__gnu_cxx::_Lock_policy)2> _Stack_28;
  
  if ((this->assembly).nbodies == 0) {
    this->collision_system_type = type;
    pCVar2 = GetLog();
    ChStreamOutAscii::operator<<
              (&pCVar2->super_ChStreamOutAscii,
               "Chrono was not built with Thrust support. CHRONO collision system type not available.\n"
              );
    this->collision_system_type = BULLET;
    if (type != CHRONO) {
      if (type == BULLET) {
        std::make_shared<chrono::collision::ChCollisionSystemBullet>();
        std::__shared_ptr<chrono::collision::ChCollisionSystem,(__gnu_cxx::_Lock_policy)2>::
        operator=((__shared_ptr<chrono::collision::ChCollisionSystem,(__gnu_cxx::_Lock_policy)2> *)
                  &this->collision_system,&_Stack_28);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_28._M_refcount);
      }
      else {
        pCVar2 = GetLog();
        ChStreamOutAscii::operator<<
                  (&pCVar2->super_ChStreamOutAscii,
                   "Collision system type not supported. Use SetCollisionSystem instead.\n");
      }
    }
    peVar1 = (this->collision_system).
             super___shared_ptr<chrono::collision::ChCollisionSystem,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    (*peVar1->_vptr_ChCollisionSystem[0xd])(peVar1,(ulong)(uint)this->nthreads_collision);
    ((this->collision_system).
     super___shared_ptr<chrono::collision::ChCollisionSystem,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    m_system = this;
    return;
  }
  __assert_fail("assembly.GetNbodies() == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/physics/ChSystem.cpp"
                ,0x159,
                "virtual void chrono::ChSystem::SetCollisionSystemType(ChCollisionSystemType)");
}

Assistant:

void ChSystem::SetCollisionSystemType(ChCollisionSystemType type) {
    assert(assembly.GetNbodies() == 0);

    collision_system_type = type;

#ifndef CHRONO_COLLISION
    GetLog() << "Chrono was not built with Thrust support. CHRONO collision system type not available.\n";
    collision_system_type = ChCollisionSystemType::BULLET;
#endif

    switch (type) {
        case ChCollisionSystemType::BULLET:
            collision_system = chrono_types::make_shared<ChCollisionSystemBullet>();
            break;
        case ChCollisionSystemType::CHRONO:
#ifdef CHRONO_COLLISION
            collision_system = chrono_types::make_shared<ChCollisionSystemChrono>();
#endif
            break;
        default:
            GetLog() << "Collision system type not supported. Use SetCollisionSystem instead.\n";
            break;
    }

    collision_system->SetNumThreads(nthreads_collision);
    collision_system->SetSystem(this);
}